

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void google::protobuf::internal::anon_unknown_23::Register
               (MessageLite *containing_type,int number,ExtensionInfo info)

{
  __node_base *p_Var1;
  size_type *psVar2;
  __node_base _Var3;
  _Hash_node_base *p_Var4;
  int iVar5;
  __node_ptr p_Var6;
  LogMessage *pLVar7;
  __node_ptr p_Var8;
  __node_base_ptr *pp_Var9;
  __node_base_ptr *pp_Var10;
  unordered_map<std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>_>
  *puVar11;
  ulong uVar12;
  size_t __bkt_count;
  ulong uVar13;
  __node_base _Var14;
  ulong __c;
  undefined1 auVar15 [16];
  LogFinisher local_91;
  size_t local_90;
  string local_88;
  undefined1 local_68 [24];
  anon_union_16_2_0e0aa8cc_for_ExtensionInfo_3 aStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_40;
  
  if ((anonymous_namespace)::
      Register(google::protobuf::MessageLite_const*,int,google::protobuf::internal::ExtensionInfo)::
      local_static_registry == '\0') {
    iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 Register(google::protobuf::MessageLite_const*,int,google::protobuf::internal::ExtensionInfo)
                                 ::local_static_registry);
    if (iVar5 != 0) {
      puVar11 = (unordered_map<std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>_>
                 *)operator_new(0x38);
      (puVar11->_M_h)._M_buckets = &(puVar11->_M_h)._M_single_bucket;
      (puVar11->_M_h)._M_bucket_count = 1;
      (puVar11->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (puVar11->_M_h)._M_element_count = 0;
      (puVar11->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
      (puVar11->_M_h)._M_rehash_policy._M_next_resize = 0;
      (puVar11->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
      OnShutdownRun(OnShutdownDelete<std::unordered_map<std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>_>_>
                    ::anon_class_1_0_00000001::__invoke,puVar11);
      Register::local_static_registry = puVar11;
      __cxa_guard_release(&(anonymous_namespace)::
                           Register(google::protobuf::MessageLite_const*,int,google::protobuf::internal::ExtensionInfo)
                           ::local_static_registry);
    }
  }
  puVar11 = Register::local_static_registry;
  (anonymous_namespace)::global_registry = Register::local_static_registry;
  local_68[0x10] = info.type;
  local_68[0x11] = info.is_repeated;
  local_68[0x12] = info.is_packed;
  local_68._19_5_ = info._3_5_;
  aStack_50.enum_validity_check.func = info.field_3.enum_validity_check.func;
  aStack_50.enum_validity_check.arg = info.field_3.enum_validity_check.arg;
  aStack_40._M_allocated_capacity = (size_type)info.descriptor;
  __c = (long)number ^ (ulong)containing_type;
  uVar12 = __c % (Register::local_static_registry->_M_h)._M_bucket_count;
  local_68._0_8_ = containing_type;
  local_68._8_4_ = number;
  p_Var6 = std::
           _Hashtable<std::pair<const_google::protobuf::MessageLite_*,_int>,_std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&Register::local_static_registry->_M_h,uVar12,(key_type *)local_68,__c);
  if (p_Var6 == (__node_ptr)0x0) {
    p_Var8 = std::__detail::
             _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<std::pair<google::protobuf::MessageLite_const*,int>const,google::protobuf::internal::ExtensionInfo>,true>>>
             ::
             _M_allocate_node<std::pair<std::pair<google::protobuf::MessageLite_const*,int>const,google::protobuf::internal::ExtensionInfo>const&>
                       ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<std::pair<google::protobuf::MessageLite_const*,int>const,google::protobuf::internal::ExtensionInfo>,true>>>
                         *)puVar11,
                        (pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>
                         *)local_68);
    local_88._M_dataplus._M_p = (pointer)puVar11;
    local_90 = (puVar11->_M_h)._M_rehash_policy._M_next_resize;
    local_88._M_string_length = (size_type)p_Var8;
    auVar15 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(puVar11->_M_h)._M_rehash_policy,(puVar11->_M_h)._M_bucket_count,
                         (puVar11->_M_h)._M_element_count);
    __bkt_count = auVar15._8_8_;
    if ((auVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pp_Var9 = (puVar11->_M_h)._M_buckets;
    }
    else {
      if (__bkt_count == 1) {
        pp_Var9 = &(puVar11->_M_h)._M_single_bucket;
        (puVar11->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        pp_Var9 = std::__detail::
                  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>,_true>_>_>
                  ::_M_allocate_buckets
                            ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>,_true>_>_>
                              *)puVar11,__bkt_count);
      }
      p_Var1 = &(puVar11->_M_h)._M_before_begin;
      _Var3._M_nxt = (puVar11->_M_h)._M_before_begin._M_nxt;
      (puVar11->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      uVar12 = 0;
LAB_00289553:
      _Var14._M_nxt = _Var3._M_nxt;
      uVar13 = uVar12;
      if (_Var14._M_nxt != (_Hash_node_base *)0x0) {
        _Var3._M_nxt = (_Var14._M_nxt)->_M_nxt;
        uVar12 = (ulong)_Var14._M_nxt[7]._M_nxt % __bkt_count;
        if (pp_Var9[uVar12] == (__node_base_ptr)0x0) goto LAB_00289582;
        (_Var14._M_nxt)->_M_nxt = pp_Var9[uVar12]->_M_nxt;
        pp_Var10 = &pp_Var9[uVar12]->_M_nxt;
        uVar12 = uVar13;
        goto LAB_00289599;
      }
      std::
      _Hashtable<std::pair<const_google::protobuf::MessageLite_*,_int>,_std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_deallocate_buckets(&puVar11->_M_h);
      (puVar11->_M_h)._M_bucket_count = __bkt_count;
      (puVar11->_M_h)._M_buckets = pp_Var9;
      uVar12 = __c % __bkt_count;
    }
    (p_Var8->
    super__Hash_node_value<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>,_true>
    ).super__Hash_node_code_cache<true>._M_hash_code = __c;
    if (pp_Var9[uVar12] == (__node_base_ptr)0x0) {
      (p_Var8->super__Hash_node_base)._M_nxt = (puVar11->_M_h)._M_before_begin._M_nxt;
      (puVar11->_M_h)._M_before_begin._M_nxt = &p_Var8->super__Hash_node_base;
      p_Var4 = (p_Var8->super__Hash_node_base)._M_nxt;
      if (p_Var4 != (_Hash_node_base *)0x0) {
        pp_Var9[(ulong)p_Var4[7]._M_nxt % (puVar11->_M_h)._M_bucket_count] =
             &p_Var8->super__Hash_node_base;
        pp_Var9 = (puVar11->_M_h)._M_buckets;
      }
      pp_Var9[uVar12] = &(puVar11->_M_h)._M_before_begin;
    }
    else {
      (p_Var8->super__Hash_node_base)._M_nxt = pp_Var9[uVar12]->_M_nxt;
      pp_Var9[uVar12]->_M_nxt = &p_Var8->super__Hash_node_base;
    }
    psVar2 = &(puVar11->_M_h)._M_element_count;
    *psVar2 = *psVar2 + 1;
    local_88._M_string_length = 0;
    std::
    _Hashtable<std::pair<const_google::protobuf::MessageLite_*,_int>,_std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Scoped_node::~_Scoped_node((_Scoped_node *)&local_88);
  }
  else {
    LogMessage::LogMessage
              ((LogMessage *)local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set.cc"
               ,0x6c);
    pLVar7 = LogMessage::operator<<
                       ((LogMessage *)local_68,"Multiple extension registrations for type \"");
    (*containing_type->_vptr_MessageLite[2])(&local_88,containing_type);
    pLVar7 = LogMessage::operator<<(pLVar7,&local_88);
    pLVar7 = LogMessage::operator<<(pLVar7,"\", field number ");
    pLVar7 = LogMessage::operator<<(pLVar7,number);
    pLVar7 = LogMessage::operator<<(pLVar7,".");
    LogFinisher::operator=(&local_91,pLVar7);
    std::__cxx11::string::~string((string *)&local_88);
    LogMessage::~LogMessage((LogMessage *)local_68);
  }
  return;
LAB_00289582:
  (_Var14._M_nxt)->_M_nxt = p_Var1->_M_nxt;
  p_Var1->_M_nxt = _Var14._M_nxt;
  pp_Var9[uVar12] = p_Var1;
  if ((_Var14._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
    pp_Var10 = pp_Var9 + uVar13;
LAB_00289599:
    *pp_Var10 = _Var14._M_nxt;
  }
  goto LAB_00289553;
}

Assistant:

void Register(const MessageLite* containing_type, int number,
              ExtensionInfo info) {
  static auto local_static_registry = OnShutdownDelete(new ExtensionRegistry);
  global_registry = local_static_registry;
  if (!InsertIfNotPresent(local_static_registry,
                               std::make_pair(containing_type, number), info)) {
    GOOGLE_LOG(FATAL) << "Multiple extension registrations for type \""
               << containing_type->GetTypeName() << "\", field number "
               << number << ".";
  }
}